

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O2

int discrete_cdf_inv(double cdf,int a,double *b)

{
  ulong uVar1;
  ulong uVar2;
  double dVar3;
  double dVar4;
  
  if ((0.0 <= cdf) && (cdf <= 1.0)) {
    dVar3 = r8vec_sum(a,b);
    uVar1 = 0;
    uVar2 = 0;
    if (0 < a) {
      uVar2 = (ulong)(uint)a;
    }
    dVar4 = 0.0;
    while( true ) {
      if (uVar2 == uVar1) {
        return a;
      }
      dVar4 = dVar4 + b[uVar1] / dVar3;
      if (cdf <= dVar4) break;
      uVar1 = uVar1 + 1;
    }
    return (int)uVar1 + 1;
  }
  std::operator<<((ostream *)&std::cerr," \n");
  std::operator<<((ostream *)&std::cerr,"DISCRETE_CDF_INV - Fatal error!\n");
  std::operator<<((ostream *)&std::cerr,"  CDF < 0 or 1 < CDF.\n");
  exit(1);
}

Assistant:

int discrete_cdf_inv ( double cdf, int a, double b[] )

//****************************************************************************80
//
//  Purpose:
//
//    DISCRETE_CDF_INV inverts the Discrete CDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    15 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double CDF, the value of the CDF.
//    0.0 <= CDF <= 1.0.
//
//    Input, int A, the number of probabilities assigned.
//
//    Input, double B[A], the relative probabilities of outcomes
//    1 through A.  Each entry must be nonnegative.
//
//    Output, int DISCRETE_CDF_INV, the corresponding argument for which
//    CDF(X-1) < CDF <= CDF(X)
//
{
  double b_sum;
  double cum;
  int j;
  int x;

  if ( cdf < 0.0 || 1.0 < cdf )
  {
    cerr << " \n";
    cerr << "DISCRETE_CDF_INV - Fatal error!\n";
    cerr << "  CDF < 0 or 1 < CDF.\n";
    exit ( 1 );
  }

  b_sum = r8vec_sum ( a, b );

  cum = 0.0;

  for ( j = 1; j <= a; j++ )
  {
    cum = cum + b[j-1] / b_sum;

    if ( cdf <= cum )
    {
      x = j;
      return x;
    }
  }

  x = a;

  return x;
}